

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

void __thiscall duckdb::ColumnData::BeginScanVectorInternal(ColumnData *this,ColumnScanState *state)

{
  pointer puVar1;
  pointer puVar2;
  _Head_base<0UL,_duckdb::SegmentScanState_*,_false> _Var3;
  idx_t iVar4;
  pointer *__ptr;
  pointer puVar5;
  
  puVar1 = (state->previous_states).
           super_vector<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (state->previous_states).
           super_vector<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar5 = puVar1;
  if (puVar2 != puVar1) {
    do {
      _Var3._M_head_impl =
           (puVar5->
           super_unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::SegmentScanState_*,_std::default_delete<duckdb::SegmentScanState>_>
           .super__Head_base<0UL,_duckdb::SegmentScanState_*,_false>._M_head_impl;
      if (_Var3._M_head_impl != (SegmentScanState *)0x0) {
        (*(_Var3._M_head_impl)->_vptr_SegmentScanState[1])();
      }
      (puVar5->
      super_unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>).
      _M_t.
      super___uniq_ptr_impl<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::SegmentScanState_*,_std::default_delete<duckdb::SegmentScanState>_>
      .super__Head_base<0UL,_duckdb::SegmentScanState_*,_false>._M_head_impl =
           (SegmentScanState *)0x0;
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar2);
    (state->previous_states).
    super_vector<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  if (state->initialized == false) {
    ColumnSegment::InitializeScan(state->current,state);
    state->internal_index = (state->current->super_SegmentBase<duckdb::ColumnSegment>).start;
    state->initialized = true;
  }
  iVar4 = state->row_index - state->internal_index;
  if (state->internal_index <= state->row_index && iVar4 != 0) {
    (*((state->current->function)._M_data)->skip)(state->current,state,iVar4);
    state->internal_index = state->row_index;
  }
  return;
}

Assistant:

void ColumnData::BeginScanVectorInternal(ColumnScanState &state) {
	state.previous_states.clear();
	if (!state.initialized) {
		D_ASSERT(state.current);
		state.current->InitializeScan(state);
		state.internal_index = state.current->start;
		state.initialized = true;
	}
	D_ASSERT(data.HasSegment(state.current));
	D_ASSERT(state.internal_index <= state.row_index);
	if (state.internal_index < state.row_index) {
		state.current->Skip(state);
	}
	D_ASSERT(state.current->type == type);
}